

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>,_true>
 duckdb::RangeFunctionLocalInit
           (ExecutionContext *context,TableFunctionInitInput *input,
           GlobalTableFunctionState *global_state)

{
  ClientContext *in_RAX;
  
  make_uniq<duckdb::RangeFunctionLocalState>();
  context->client = in_RAX;
  return (unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
          )(unique_ptr<duckdb::LocalTableFunctionState,_std::default_delete<duckdb::LocalTableFunctionState>_>
            )context;
}

Assistant:

static unique_ptr<LocalTableFunctionState> RangeFunctionLocalInit(ExecutionContext &context,
                                                                  TableFunctionInitInput &input,
                                                                  GlobalTableFunctionState *global_state) {
	return make_uniq<RangeFunctionLocalState>();
}